

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<unsigned_long,unsigned_long&,unsigned_long>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args,
          unsigned_long *args_1,unsigned_long *args_2)

{
  string_view fmt_00;
  string_view_t msg;
  remove_cvref_t<fmt::v11::basic_appender<char>_> rVar1;
  char *s;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  time_point in_stack_00000020;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffa80;
  logger *in_stack_fffffffffffffa88;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffa90;
  basic_appender<char> *in_stack_fffffffffffffab8;
  format_args in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffad0;
  buffer<char> *this_00;
  size_t in_stack_fffffffffffffad8;
  level_enum lvl_00;
  log_msg *this_01;
  size_t in_stack_fffffffffffffb00;
  string_view_t in_stack_fffffffffffffb08;
  source_loc in_stack_fffffffffffffb20;
  basic_string_view<char> local_468 [2];
  char *local_448;
  size_t sStack_440;
  log_msg *local_438;
  buffer<char> *local_3d0;
  undefined8 local_3c8 [2];
  undefined8 local_3b8 [2];
  undefined8 local_3a8 [2];
  undefined8 local_398;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 local_380;
  basic_appender<char> local_378 [4];
  buffer<char> local_358 [9];
  undefined1 local_232;
  byte local_231;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 local_210;
  undefined8 local_208;
  duration local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_a0;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 *local_78;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  this_01 = (log_msg *)&stack0x00000008;
  local_230 = in_R9;
  local_228 = in_R8;
  local_210 = in_RDX;
  local_208 = in_RCX;
  local_231 = should_log(in_stack_fffffffffffffa88,
                         (level_enum)((ulong)in_stack_fffffffffffffa80 >> 0x20));
  local_232 = details::backtracer::enabled((backtracer *)0x20eba1);
  if (((local_231 & 1) != 0) || ((bool)local_232)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffa80,(allocator<char> *)in_stack_fffffffffffffa78);
    ::fmt::v11::basic_appender<char>::basic_appender(local_378,local_358);
    local_388 = local_210;
    local_380 = local_208;
    local_1f0 = local_228;
    local_1f8 = local_230;
    local_200 = in_stack_00000020.__d.__r;
    local_80 = *local_228;
    local_78 = local_3c8;
    local_88 = local_3b8;
    local_90 = *local_230;
    local_98 = local_3a8;
    local_a0 = *(undefined8 *)in_stack_00000020.__d.__r;
    local_1e0 = &local_398;
    local_1e8 = local_3c8;
    local_398 = 0x444;
    fmt_00.size_ = in_stack_fffffffffffffad8;
    fmt_00.data_ = in_stack_fffffffffffffad0;
    local_30 = local_80;
    local_28 = local_78;
    local_20 = local_90;
    local_18 = local_88;
    local_10 = local_a0;
    local_8 = local_98;
    local_3c8[0] = local_80;
    local_3b8[0] = local_90;
    local_3a8[0] = local_a0;
    local_390 = local_1e8;
    rVar1 = ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                      (in_stack_fffffffffffffab8,fmt_00,in_stack_fffffffffffffac0);
    local_438 = *(log_msg **)&this_01->level;
    local_448 = (this_01->logger_name).data_;
    sStack_440 = (this_01->logger_name).size_;
    local_3d0 = rVar1.container;
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    lvl_00 = (level_enum)((ulong)rVar1.container >> 0x20);
    this_00 = local_358;
    s = ::fmt::v11::detail::buffer<char>::data(this_00);
    sVar2 = ::fmt::v11::detail::buffer<char>::size(this_00);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_468,s,sVar2);
    msg.size_ = in_stack_fffffffffffffb00;
    msg.data_ = in_RDI;
    sVar2 = sStack_440;
    log_msg_00 = local_438;
    details::log_msg::log_msg
              (this_01,in_stack_fffffffffffffb20,in_stack_fffffffffffffb08,lvl_00,msg);
    log_it_(in_stack_fffffffffffffa90,log_msg_00,SUB81(sVar2 >> 0x38,0),SUB81(sVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x20eec6);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }